

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

HighsStatus __thiscall HEkk::setBasis(HEkk *this,HighsBasis *highs_basis)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  HighsBasisStatus HVar5;
  uint num_row;
  HighsInt HVar6;
  HighsDebugStatus HVar7;
  HighsStatus HVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  double dVar4;
  
  HVar7 = debugHighsBasisConsistent(this->options_,&this->lp_,highs_basis);
  if (HVar7 == kLogicalError) {
    highsLogDev(&(this->options_->super_HighsOptionsStruct).log_options,kError,
                "Supposed to be a Highs basis, but not valid\n");
    HVar8 = kError;
  }
  else {
    iVar12 = (this->lp_).num_col_;
    lVar13 = (long)iVar12;
    num_row = (this->lp_).num_row_;
    SimplexBasis::setup(&this->basis_,iVar12,num_row);
    HVar6 = highs_basis->debug_update_count;
    (this->basis_).debug_id = highs_basis->debug_id;
    (this->basis_).debug_update_count = HVar6;
    std::__cxx11::string::_M_assign((string *)&(this->basis_).debug_origin_name);
    if (lVar13 < 1) {
      iVar12 = 0;
    }
    else {
      lVar10 = 0;
      iVar12 = 0;
      do {
        if ((highs_basis->col_status).
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] == kBasic) {
          (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar10] = '\0';
          (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar10] = '\0';
          lVar9 = (long)iVar12;
          iVar12 = iVar12 + 1;
          (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar9] = (HighsInt)lVar10;
          HighsHashHelpers::sparse_combine(&(this->basis_).hash,(HighsInt)lVar10);
        }
        else {
          dVar2 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar10];
          pdVar1 = (this->lp_).col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar10;
          dVar3 = *pdVar1;
          dVar4 = *pdVar1;
          (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar10] = '\x01';
          if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar3))) {
            HVar5 = (highs_basis->col_status).
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10];
            if (HVar5 == kUpper) {
              (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = -1;
            }
            else {
              if (HVar5 != kLower) goto LAB_00342ab3;
              (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] = '\x01';
            }
          }
          else {
LAB_00342ab3:
            (this->basis_).nonbasicMove_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar10] = '\0';
          }
        }
        lVar10 = lVar10 + 1;
      } while (lVar13 != lVar10);
    }
    if (0 < (int)num_row) {
      uVar11 = 0;
      do {
        if ((highs_basis->row_status).
            super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11] == kBasic) {
          (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar13] = '\0';
          (this->basis_).nonbasicMove_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar13] = '\0';
          lVar10 = (long)iVar12;
          iVar12 = iVar12 + 1;
          (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[lVar10] = (HighsInt)lVar13;
          HighsHashHelpers::sparse_combine(&(this->basis_).hash,(HighsInt)lVar13);
        }
        else {
          dVar2 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar11];
          pdVar1 = (this->lp_).row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar11;
          dVar3 = *pdVar1;
          dVar4 = *pdVar1;
          (this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar13] = '\x01';
          if ((dVar2 != dVar4) || (NAN(dVar2) || NAN(dVar3))) {
            HVar5 = (highs_basis->row_status).
                    super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar11];
            if (HVar5 == kUpper) {
              (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = '\x01';
            }
            else {
              if (HVar5 != kLower) goto LAB_00342b75;
              (this->basis_).nonbasicMove_.
              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
              super__Vector_impl_data._M_start[lVar13] = -1;
            }
          }
          else {
LAB_00342b75:
            (this->basis_).nonbasicMove_.
            super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar13] = '\0';
          }
        }
        uVar11 = uVar11 + 1;
        lVar13 = lVar13 + 1;
      } while (num_row != uVar11);
    }
    (this->status_).has_basis = true;
    HVar8 = kOk;
  }
  return HVar8;
}

Assistant:

HighsStatus HEkk::setBasis(const HighsBasis& highs_basis) {
  // Shouldn't have to check the incoming basis since this is an
  // internal call, but it may be a basis that's set up internally
  // with errors :-) ...
  //
  if (kDebugMipNodeDualFeasible) {
    // The basis should be dual feasible unless it was alien
    debug_dual_feasible = !highs_basis.was_alien;
  } else {
    assert(!debug_dual_feasible);
  }
  HighsOptions& options = *options_;
  if (debugHighsBasisConsistent(options, lp_, highs_basis) ==
      HighsDebugStatus::kLogicalError) {
    highsLogDev(options_->log_options, HighsLogType::kError,
                "Supposed to be a Highs basis, but not valid\n");
    return HighsStatus::kError;
  }
  HighsInt num_col = lp_.num_col_;
  HighsInt num_row = lp_.num_row_;
  // Set up the basis in case it has not yet been done for this LP
  basis_.setup(num_col, num_row);
  basis_.debug_id = highs_basis.debug_id;
  basis_.debug_update_count = highs_basis.debug_update_count;
  basis_.debug_origin_name = highs_basis.debug_origin_name;
  assert(basis_.debug_origin_name != "");
  HighsInt num_basic_variables = 0;
  for (HighsInt iCol = 0; iCol < num_col; iCol++) {
    HighsInt iVar = iCol;
    const double lower = lp_.col_lower_[iCol];
    const double upper = lp_.col_upper_[iCol];
    if (highs_basis.col_status[iCol] == HighsBasisStatus::kBasic) {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
      basis_.nonbasicMove_[iVar] = 0;
      basis_.basicIndex_[num_basic_variables++] = iVar;
      HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    } else {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagTrue;
      if (lower == upper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      } else if (highs_basis.col_status[iCol] == HighsBasisStatus::kLower) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveUp;
      } else if (highs_basis.col_status[iCol] == HighsBasisStatus::kUpper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveDn;
      } else {
        assert(highs_basis.col_status[iCol] == HighsBasisStatus::kZero);
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      }
    }
  }
  for (HighsInt iRow = 0; iRow < num_row; iRow++) {
    HighsInt iVar = num_col + iRow;
    const double lower = lp_.row_lower_[iRow];
    const double upper = lp_.row_upper_[iRow];
    if (highs_basis.row_status[iRow] == HighsBasisStatus::kBasic) {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagFalse;
      basis_.nonbasicMove_[iVar] = 0;
      basis_.basicIndex_[num_basic_variables++] = iVar;
      HighsHashHelpers::sparse_combine(basis_.hash, iVar);
    } else {
      basis_.nonbasicFlag_[iVar] = kNonbasicFlagTrue;
      if (lower == upper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      } else if (highs_basis.row_status[iRow] == HighsBasisStatus::kLower) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveDn;
      } else if (highs_basis.row_status[iRow] == HighsBasisStatus::kUpper) {
        basis_.nonbasicMove_[iVar] = kNonbasicMoveUp;
      } else {
        assert(highs_basis.row_status[iRow] == HighsBasisStatus::kZero);
        basis_.nonbasicMove_[iVar] = kNonbasicMoveZe;
      }
    }
  }
  status_.has_basis = true;
  return HighsStatus::kOk;
}